

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

void pbrt::DisplayStatic(string *title,Image *image,optional<pbrt::ImageChannelDesc> *channelDesc)

{
  bool bVar1;
  int iVar2;
  DisplayItem item;
  string local_f0;
  aligned_storage_t<sizeof(pbrt::ImageChannelDesc),_alignof(pbrt::ImageChannelDesc)> local_d0;
  char local_a0;
  DisplayItem local_98;
  
  pstd::optional<pbrt::ImageChannelDesc>::optional
            ((optional<pbrt::ImageChannelDesc> *)&local_d0.__align,channelDesc);
  GetImageDisplayItem(&local_98,title,image,(optional<pbrt::ImageChannelDesc> *)&local_d0.__align);
  if (local_a0 == '\x01') {
    local_d0._40_8_ = 0;
    (**(code **)(*(long *)local_d0.__align + 0x18))
              (local_d0.__align,local_d0._8_8_,local_d0._32_8_ << 2,4);
    local_a0 = '\0';
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar2 == 0) {
    bVar1 = DisplayItem::Display(&local_98,channel);
    if (!bVar1 && LOGGING_LogLevel < 2) {
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string_const&>
                (&local_f0,"Unable to display static content \"%s\".",title);
      Log(Error,
          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
          ,0x1d3,local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                 local_f0.field_2._M_local_buf[0]) + 1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)mutex);
    std::
    vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
    ::~vector(&local_98.channelBuffers);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98.channelNames);
    if (local_98.getTileValues.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_98.getTileValues.super__Function_base._M_manager)
                ((_Any_data *)&local_98.getTileValues,(_Any_data *)&local_98.getTileValues,
                 __destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.title._M_dataplus._M_p != &local_98.title.field_2) {
      operator_delete(local_98.title._M_dataplus._M_p,
                      local_98.title.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void DisplayStatic(const std::string &title, const Image &image,
                   pstd::optional<ImageChannelDesc> channelDesc) {
    DisplayItem item = GetImageDisplayItem(title, image, channelDesc);

    std::lock_guard<std::mutex> lock(mutex);
    if (!item.Display(*channel))
        LOG_ERROR("Unable to display static content \"%s\".", title);
}